

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc_act.c
# Opt level: O0

bool aedit_builder(CHAR_DATA *ch,char *argument)

{
  long lVar1;
  int iVar2;
  char *pcVar3;
  char *in_RSI;
  char *in_RDI;
  char *unaff_retaddr;
  char buf [4608];
  AREA_DATA_conflict *pArea;
  undefined4 in_stack_ffffffffffffedd0;
  char in_stack_ffffffffffffedd8;
  char cVar4;
  undefined7 in_stack_ffffffffffffedd9;
  char *in_stack_ffffffffffffede0;
  char *in_stack_ffffffffffffedf8;
  char *in_stack_ffffffffffffffd0;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  bool bVar5;
  
  lVar1 = *(long *)(*(long *)(in_RDI + 0x80) + 0x6c60);
  if (*in_RSI == '\0') {
    send_to_char(in_stack_ffffffffffffede0,
                 (CHAR_DATA *)CONCAT71(in_stack_ffffffffffffedd9,in_stack_ffffffffffffedd8));
    send_to_char(in_stack_ffffffffffffede0,
                 (CHAR_DATA *)CONCAT71(in_stack_ffffffffffffedd9,in_stack_ffffffffffffedd8));
    bVar5 = false;
  }
  else {
    if ((*in_RSI < 'a') || ('z' < *in_RSI)) {
      iVar2 = (int)*in_RSI;
    }
    else {
      iVar2 = *in_RSI + -0x20;
    }
    *in_RSI = (char)iVar2;
    pcVar3 = strstr(*(char **)(lVar1 + 0x160),in_RSI);
    if (pcVar3 == (char *)0x0) {
      cVar4 = '\0';
      pcVar3 = strstr(*(char **)(lVar1 + 0x160),"None");
      if (pcVar3 != (char *)0x0) {
        pcVar3 = string_replace(unaff_retaddr,
                                (char *)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8
                                                ),in_RDI);
        *(char **)(lVar1 + 0x160) = pcVar3;
        pcVar3 = string_unpad(in_stack_ffffffffffffffd0);
        *(char **)(lVar1 + 0x160) = pcVar3;
      }
      if (**(char **)(lVar1 + 0x160) != '\0') {
        strcat(&stack0xffffffffffffedd8,*(char **)(lVar1 + 0x160));
        strcat(&stack0xffffffffffffedd8," ");
      }
      strcat(&stack0xffffffffffffedd8,in_RSI);
      free_pstring((char *)CONCAT44(iVar2,in_stack_ffffffffffffedd0));
      pcVar3 = palloc_string(in_stack_ffffffffffffedf8);
      pcVar3 = string_proper(pcVar3);
      *(char **)(lVar1 + 0x160) = pcVar3;
      send_to_char(in_stack_ffffffffffffede0,(CHAR_DATA *)CONCAT71(in_stack_ffffffffffffedd9,cVar4))
      ;
      bVar5 = true;
    }
    else {
      pcVar3 = string_replace(unaff_retaddr,
                              (char *)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),
                              in_RDI);
      *(char **)(lVar1 + 0x160) = pcVar3;
      pcVar3 = string_unpad(in_stack_ffffffffffffffd0);
      *(char **)(lVar1 + 0x160) = pcVar3;
      if (**(char **)(lVar1 + 0x160) == '\0') {
        free_pstring((char *)CONCAT44(iVar2,in_stack_ffffffffffffedd0));
        pcVar3 = palloc_string(in_stack_ffffffffffffedf8);
        *(char **)(lVar1 + 0x160) = pcVar3;
      }
      send_to_char(in_stack_ffffffffffffede0,
                   (CHAR_DATA *)CONCAT71(in_stack_ffffffffffffedd9,in_stack_ffffffffffffedd8));
      bVar5 = true;
    }
  }
  return bVar5;
}

Assistant:

bool aedit_builder(CHAR_DATA *ch, char *argument)
{
	AREA_DATA *pArea;
	char buf[MAX_STRING_LENGTH];

	EDIT_AREA(ch, pArea);

	if (argument[0] == '\0')
	{
		send_to_char("Syntax:  builder [$name]  -toggles builder\n\r", ch);
		send_to_char("Syntax:  builder All      -allows everyone\n\r", ch);
		return false;
	}

	argument[0] = UPPER(argument[0]);

	if (strstr(pArea->builders, argument) != (char *)'\0')
	{
		pArea->builders = string_replace(pArea->builders, argument, "\0");
		pArea->builders = string_unpad(pArea->builders);

		if (pArea->builders[0] == '\0')
		{
			free_pstring(pArea->builders);
			pArea->builders = palloc_string("None");
		}

		send_to_char("Builder removed.\n\r", ch);
		return true;
	}
	else
	{
		buf[0] = '\0';

		if (strstr(pArea->builders, "None") != (char *)'\0')
		{
			pArea->builders = string_replace(pArea->builders, "None", "\0");
			pArea->builders = string_unpad(pArea->builders);
		}

		if (pArea->builders[0] != '\0')
		{
			strcat(buf, pArea->builders);
			strcat(buf, " ");
		}

		strcat(buf, argument);
		free_pstring(pArea->builders);
		pArea->builders = string_proper(palloc_string(buf));

		send_to_char("Builder added.\n\r", ch);
		return true;
	}

	return false;
}